

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O2

LispPTR releasingvmempage(LispPTR ptr)

{
  LispPTR LVar1;
  LispPTR *pLVar2;
  
  LVar1 = findptrsbuffer(ptr);
  if (LVar1 == 0) {
    LVar1 = 0;
  }
  else {
    pLVar2 = NativeAligned4FromLAddr(LVar1);
    *(byte *)((long)pLVar2 + 0xf) = *(byte *)((long)pLVar2 + 0xf) | 0x80;
    LVar1 = 0x4c;
  }
  return LVar1;
}

Assistant:

LispPTR releasingvmempage(LispPTR ptr) {
  struct buf *bptr;
  LispPTR bufferptr = findptrsbuffer(ptr);

  if (bufferptr == NIL) return (NIL); /* Not in use, OK to reclaim it */

  bptr = (struct buf *)NativeAligned4FromLAddr(bufferptr);
  bptr->noreference = T; /* Mark the buffer free to use ?? */
  return (ATOM_T);
}